

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

UniValue *
WriteUTXOSnapshot(UniValue *__return_storage_ptr__,Chainstate *chainstate,CCoinsViewCursor *pcursor,
                 CCoinsStats *maybe_stats,CBlockIndex *tip,AutoFile *afile,path *path,path *temppath
                 ,function<void_()> *interruption_point)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Type auVar2;
  uint256 *puVar3;
  pointer pcVar4;
  FILE *__stream;
  string prefix;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string end_msg;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar8;
  int iVar9;
  less<unsigned_short> *__comp;
  pointer ppVar10;
  int iVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  initializer_list<unsigned_short> __l;
  vector<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_> coins;
  size_t written_coins_count;
  COutPoint key;
  SnapshotMetadata metadata;
  Txid last_hash;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> logging_timer58;
  UniValue *pUVar14;
  int *val_05;
  pointer in_stack_fffffffffffffaf8;
  pointer ppVar15;
  pointer in_stack_fffffffffffffb00;
  pointer ppVar16;
  pointer ppVar17;
  pointer in_stack_fffffffffffffb08;
  pointer ppVar18;
  unsigned_long in_stack_fffffffffffffb10;
  uint64_t uVar19;
  undefined8 in_stack_fffffffffffffb18;
  _Alloc_hider in_stack_fffffffffffffb20;
  size_type in_stack_fffffffffffffb28;
  undefined8 in_stack_fffffffffffffb30;
  _Vector_impl_data in_stack_fffffffffffffb38;
  vector<UniValue,_std::allocator<UniValue>_> local_4a8;
  long *local_490 [2];
  long local_480 [2];
  UniValue local_470;
  long *local_418 [2];
  long local_408 [2];
  UniValue local_3f8;
  long *local_3a0 [2];
  long local_390 [2];
  UniValue local_380;
  long *local_328 [2];
  long local_318 [2];
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  string local_2e8;
  UniValue local_2c8;
  long *local_270 [2];
  long local_260 [2];
  UniValue local_250;
  long *local_1f8 [2];
  long local_1e8 [2];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c7;
  undefined4 local_1bf;
  undefined2 local_1bb;
  char local_1b9;
  Coin local_1b8;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  uint local_168 [4];
  undefined1 local_158 [48];
  MessageStartChars local_128;
  CAmount local_124;
  char *pcStack_11c;
  uchar local_114 [8];
  uchar auStack_10c [12];
  uint64_t local_100;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"WriteUTXOSnapshot","");
  puVar3 = tip->phashBlock;
  if (puVar3 != (uint256 *)0x0) {
    local_1b8.out.nValue = *(CAmount *)(puVar3->super_base_blob<256U>).m_data._M_elems;
    local_1b8.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
         (char *)*(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
    local_1b8.out.scriptPubKey.super_CScriptBase._union._8_8_ =
         *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_1b8.out.scriptPubKey.super_CScriptBase._union._16_8_ =
         *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
    base_blob<256u>::ToString_abi_cxx11_((string *)local_158,&local_1b8);
    pcVar4 = (path->super_path)._M_pathname._M_dataplus._M_p;
    local_188._0_8_ = &local_178;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,pcVar4,pcVar4 + (path->super_path)._M_pathname._M_string_length);
    pcVar4 = (temppath->super_path)._M_pathname._M_dataplus._M_p;
    local_f8._0_8_ = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,pcVar4,
               pcVar4 + (temppath->super_path)._M_pathname._M_string_length);
    val_05 = &tip->nHeight;
    tinyformat::format<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (&local_d8,(tinyformat *)"writing UTXO snapshot at height %s (%s) to file %s (via %s)"
               ,(char *)val_05,(int *)local_158,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tip);
    prefix._M_string_length = (size_type)maybe_stats;
    prefix._M_dataplus._M_p = (pointer)tip;
    prefix.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
    prefix.field_2._8_8_ = val_05;
    end_msg._M_string_length = (size_type)in_stack_fffffffffffffb00;
    end_msg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaf8;
    end_msg.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb08;
    end_msg.field_2._8_8_ = in_stack_fffffffffffffb10;
    BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Timer
              (&local_98,prefix,end_msg,(LogFlags)local_b8,SUB81(&local_d8,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ != &local_e8) {
      operator_delete((void *)local_f8._0_8_,local_e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._0_8_ != &local_178) {
      operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    puVar3 = tip->phashBlock;
    if (puVar3 != (uint256 *)0x0) {
      auVar2 = *&(((chainstate->m_chainman->m_options).chainparams)->pchMessageStart)._M_elems;
      local_1b8.out.nValue = *(CAmount *)(puVar3->super_base_blob<256U>).m_data._M_elems;
      local_1b8.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)*(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
      local_1b8.out.scriptPubKey.super_CScriptBase._union._8_8_ =
           *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_1b8.out.scriptPubKey.super_CScriptBase._union._16_8_ =
           *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
      uVar19 = maybe_stats->coins_count;
      local_188._0_2_ = 2;
      __comp = (less<unsigned_short> *)local_f8;
      __l._M_len = 1;
      __l._M_array = (iterator)local_188;
      std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
                ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
                 local_158,__l,__comp,(allocator_type *)&local_2e8);
      local_124 = local_1b8.out.nValue;
      pcStack_11c = local_1b8.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
      local_114[0] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[8];
      local_114[1] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[9];
      local_114[2] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[10];
      local_114[3] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0xb];
      local_114[4] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0xc];
      local_114[5] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0xd];
      local_114[6] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0xe];
      local_114[7] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0xf];
      auStack_10c[0] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0x10];
      auStack_10c[1] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0x11];
      auStack_10c[2] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0x12];
      auStack_10c[3] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0x13];
      auStack_10c[4] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0x14];
      auStack_10c[5] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0x15];
      auStack_10c[6] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0x16];
      auStack_10c[7] = local_1b8.out.scriptPubKey.super_CScriptBase._union.direct[0x17];
      local_128._M_elems = auVar2;
      local_100 = uVar19;
      Serialize<AutoFile,_node::SnapshotMetadata>(afile,(SnapshotMetadata *)local_158);
      local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   )0x0;
      local_188 = (undefined1  [16])0x0;
      local_168[0] = 0xffffffff;
      local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )0x0;
      local_f8 = (undefined1  [16])0x0;
      CTxOut::CTxOut(&local_1b8.out);
      local_1b8._40_4_ = 0;
      iVar11 = 0;
      uVar19 = 0;
      ppVar18 = (pointer)0x0;
      ppVar10 = (pointer)0x0;
      ppVar16 = (pointer)0x0;
      (*pcursor->_vptr_CCoinsViewCursor[2])(pcursor,local_188);
      local_e8 = local_178;
      local_f8 = local_188;
      while( true ) {
        iVar9 = (*pcursor->_vptr_CCoinsViewCursor[4])(pcursor);
        if ((char)iVar9 == '\0') break;
        if (((uint)(iVar11 * 0x3afb7e91) >> 3 | iVar11 * 0x20000000) < 0xd1b72) {
          if ((interruption_point->super__Function_base)._M_manager == (_Manager_type)0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0029f1bd;
            std::__throw_bad_function_call();
            goto LAB_0029ee33;
          }
          (*interruption_point->_M_invoker)((_Any_data *)interruption_point);
        }
        iVar9 = (*pcursor->_vptr_CCoinsViewCursor[2])(pcursor,local_188);
        if (((char)iVar9 != '\0') &&
           (iVar9 = (*pcursor->_vptr_CCoinsViewCursor[3])(pcursor,&local_1b8), (char)iVar9 != '\0'))
        {
          auVar13[0] = -(local_178._M_local_buf[0] == local_e8._M_local_buf[0]);
          auVar13[1] = -(local_178._M_local_buf[1] == local_e8._M_local_buf[1]);
          auVar13[2] = -(local_178._M_local_buf[2] == local_e8._M_local_buf[2]);
          auVar13[3] = -(local_178._M_local_buf[3] == local_e8._M_local_buf[3]);
          auVar13[4] = -(local_178._M_local_buf[4] == local_e8._M_local_buf[4]);
          auVar13[5] = -(local_178._M_local_buf[5] == local_e8._M_local_buf[5]);
          auVar13[6] = -(local_178._M_local_buf[6] == local_e8._M_local_buf[6]);
          auVar13[7] = -(local_178._M_local_buf[7] == local_e8._M_local_buf[7]);
          auVar13[8] = -(local_178._M_local_buf[8] == local_e8._M_local_buf[8]);
          auVar13[9] = -(local_178._M_local_buf[9] == local_e8._M_local_buf[9]);
          auVar13[10] = -(local_178._M_local_buf[10] == local_e8._M_local_buf[10]);
          auVar13[0xb] = -(local_178._M_local_buf[0xb] == local_e8._M_local_buf[0xb]);
          auVar13[0xc] = -(local_178._M_local_buf[0xc] == local_e8._M_local_buf[0xc]);
          auVar13[0xd] = -(local_178._M_local_buf[0xd] == local_e8._M_local_buf[0xd]);
          auVar13[0xe] = -(local_178._M_local_buf[0xe] == local_e8._M_local_buf[0xe]);
          auVar13[0xf] = -(local_178._M_local_buf[0xf] == local_e8._M_local_buf[0xf]);
          auVar12[0] = -(local_188[0] == local_f8[0]);
          auVar12[1] = -(local_188[1] == local_f8[1]);
          auVar12[2] = -(local_188[2] == local_f8[2]);
          auVar12[3] = -(local_188[3] == local_f8[3]);
          auVar12[4] = -(local_188[4] == local_f8[4]);
          auVar12[5] = -(local_188[5] == local_f8[5]);
          auVar12[6] = -(local_188[6] == local_f8[6]);
          auVar12[7] = -(local_188[7] == local_f8[7]);
          auVar12[8] = -(local_188[8] == local_f8[8]);
          auVar12[9] = -(local_188[9] == local_f8[9]);
          auVar12[10] = -(local_188[10] == local_f8[10]);
          auVar12[0xb] = -(local_188[0xb] == local_f8[0xb]);
          auVar12[0xc] = -(local_188[0xc] == local_f8[0xc]);
          auVar12[0xd] = -(local_188[0xd] == local_f8[0xd]);
          auVar12[0xe] = -(local_188[0xe] == local_f8[0xe]);
          auVar12[0xf] = -(local_188[0xf] == local_f8[0xf]);
          auVar12 = auVar12 & auVar13;
          if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) {
            AutoFile::write(afile,(int)local_f8,(void *)0x20,(size_t)__comp);
            WriteCompactSize<AutoFile>
                      (afile,((long)ppVar16 - (long)ppVar10 >> 3) * 0x6db6db6db6db6db7);
            ppVar15 = ppVar10;
            ppVar17 = ppVar16;
            if (ppVar10 == ppVar16) {
              local_e8._M_local_buf = local_178._M_local_buf;
              local_f8 = local_188;
            }
            else {
              do {
                WriteCompactSize<AutoFile>(afile,(ulong)ppVar10->first);
                Coin::Serialize<AutoFile>(&ppVar10->second,afile);
                uVar19 = uVar19 + 1;
                ppVar10 = ppVar10 + 1;
                ppVar5 = ppVar15;
                ppVar6 = ppVar15;
                ppVar7 = ppVar17;
                auVar12 = local_188;
                aVar8 = local_178;
              } while (ppVar10 != ppVar16);
              for (; local_e8 = aVar8, local_f8 = auVar12, ppVar16 = ppVar7, ppVar10 = ppVar6,
                  ppVar17 != ppVar5; ppVar5 = ppVar5 + 1) {
                if (0x1c < (ppVar5->second).out.scriptPubKey.super_CScriptBase._size) {
                  free((ppVar5->second).out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                       indirect);
                  (ppVar5->second).out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                  indirect = (char *)0x0;
                }
                ppVar6 = ppVar10;
                ppVar7 = ppVar15;
                auVar12 = local_f8;
                aVar8 = local_e8;
              }
            }
          }
          std::vector<std::pair<unsigned_int,Coin>,std::allocator<std::pair<unsigned_int,Coin>>>::
          emplace_back<unsigned_int&,Coin&>
                    ((vector<std::pair<unsigned_int,Coin>,std::allocator<std::pair<unsigned_int,Coin>>>
                      *)&stack0xfffffffffffffaf8,local_168,&local_1b8);
        }
        iVar11 = iVar11 + 1;
        (*pcursor->_vptr_CCoinsViewCursor[5])(pcursor);
      }
      ppVar15 = ppVar10;
      ppVar17 = ppVar16;
      if (ppVar10 != ppVar16) {
        AutoFile::write(afile,(int)local_f8,(void *)0x20,(size_t)__comp);
        WriteCompactSize<AutoFile>(afile,((long)ppVar16 - (long)ppVar10 >> 3) * 0x6db6db6db6db6db7);
        ppVar15 = ppVar10;
        ppVar17 = ppVar16;
        for (; ppVar10 != ppVar16; ppVar10 = ppVar10 + 1) {
          WriteCompactSize<AutoFile>(afile,(ulong)ppVar10->first);
          Coin::Serialize<AutoFile>(&ppVar10->second,afile);
          uVar19 = uVar19 + 1;
        }
      }
      local_2e8._M_dataplus._M_p._0_1_ = uVar19 == maybe_stats->coins_count;
      inline_check_non_fatal<bool>
                ((bool *)&local_2e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
                 ,0xb8e,"WriteUTXOSnapshot","written_coins_count == maybe_stats->coins_count");
      __stream = (FILE *)afile->m_file;
      afile->m_file = (FILE *)0x0;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      local_1d8 = &local_1c8;
      __return_storage_ptr__->typ = VOBJ;
      (__return_storage_ptr__->val)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->val).field_2;
      (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
      *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_1c7;
      *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_1bf;
      *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_1bb;
      (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_1b9;
      (__return_storage_ptr__->val)._M_string_length = 0;
      local_1d0 = 0;
      local_1c8 = 0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined1 (*) [16])
       &(__return_storage_ptr__->keys).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pUVar14 = __return_storage_ptr__;
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"coins_written","");
      UniValue::UniValue<unsigned_long_&,_unsigned_long,_true>
                (&local_250,(unsigned_long *)&stack0xfffffffffffffb10);
      key_00._M_string_length = (size_type)maybe_stats;
      key_00._M_dataplus._M_p = (pointer)tip;
      key_00.field_2._M_allocated_capacity = (size_type)pUVar14;
      key_00.field_2._8_8_ = val_05;
      val.val._M_dataplus._M_p = (pointer)ppVar17;
      val._0_8_ = ppVar15;
      val.val._M_string_length = (size_type)ppVar18;
      val.val.field_2._M_allocated_capacity = uVar19;
      val.val.field_2._8_8_ = in_stack_fffffffffffffb18;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb20._M_p;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb28;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb30;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffb38;
      UniValue::pushKV(__return_storage_ptr__,key_00,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_250.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_250.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250.val._M_dataplus._M_p != &local_250.val.field_2) {
        operator_delete(local_250.val._M_dataplus._M_p,
                        local_250.val.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"base_hash","");
      puVar3 = tip->phashBlock;
      if (puVar3 != (uint256 *)0x0) {
        local_308 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
        uStack_300 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
        local_2f8 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
        uStack_2f0 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
        base_blob<256u>::ToString_abi_cxx11_(&local_2e8,&local_308);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_2c8,&local_2e8);
        key_01._M_string_length = (size_type)maybe_stats;
        key_01._M_dataplus._M_p = (pointer)tip;
        key_01.field_2._M_allocated_capacity = (size_type)pUVar14;
        key_01.field_2._8_8_ = val_05;
        val_00.val._M_dataplus._M_p = (pointer)ppVar17;
        val_00._0_8_ = ppVar15;
        val_00.val._M_string_length = (size_type)ppVar18;
        val_00.val.field_2._M_allocated_capacity = uVar19;
        val_00.val.field_2._8_8_ = in_stack_fffffffffffffb18;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb20._M_p;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb28;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb30;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffb38;
        UniValue::pushKV(__return_storage_ptr__,key_01,val_00);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2c8.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2c8.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.val._M_dataplus._M_p != &local_2c8.val.field_2) {
          operator_delete(local_2c8.val._M_dataplus._M_p,
                          local_2c8.val.field_2._M_allocated_capacity + 1);
        }
        paVar1 = &local_2e8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_2e8._M_dataplus._M_p._1_7_,local_2e8._M_dataplus._M_p._0_1_) != paVar1
           ) {
          operator_delete((undefined1 *)
                          CONCAT71(local_2e8._M_dataplus._M_p._1_7_,local_2e8._M_dataplus._M_p._0_1_
                                  ),local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_270[0] != local_260) {
          operator_delete(local_270[0],local_260[0] + 1);
        }
        local_328[0] = local_318;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"base_height","");
        UniValue::UniValue<const_int_&,_int,_true>(&local_380,val_05);
        key_02._M_string_length = (size_type)maybe_stats;
        key_02._M_dataplus._M_p = (pointer)tip;
        key_02.field_2._M_allocated_capacity = (size_type)pUVar14;
        key_02.field_2._8_8_ = val_05;
        val_01.val._M_dataplus._M_p = (pointer)ppVar17;
        val_01._0_8_ = ppVar15;
        val_01.val._M_string_length = (size_type)ppVar18;
        val_01.val.field_2._M_allocated_capacity = uVar19;
        val_01.val.field_2._8_8_ = in_stack_fffffffffffffb18;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb20._M_p;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb28;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb30;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffb38;
        UniValue::pushKV(__return_storage_ptr__,key_02,val_01);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_380.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_380.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380.val._M_dataplus._M_p != &local_380.val.field_2) {
          operator_delete(local_380.val._M_dataplus._M_p,
                          local_380.val.field_2._M_allocated_capacity + 1);
        }
        if (local_328[0] != local_318) {
          operator_delete(local_328[0],local_318[0] + 1);
        }
        local_3a0[0] = local_390;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"path","");
        fs::path::utf8string_abi_cxx11_(&local_2e8,path);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_3f8,&local_2e8);
        key_03._M_string_length = (size_type)maybe_stats;
        key_03._M_dataplus._M_p = (pointer)tip;
        key_03.field_2._M_allocated_capacity = (size_type)pUVar14;
        key_03.field_2._8_8_ = val_05;
        val_02.val._M_dataplus._M_p = (pointer)ppVar17;
        val_02._0_8_ = ppVar15;
        val_02.val._M_string_length = (size_type)ppVar18;
        val_02.val.field_2._M_allocated_capacity = uVar19;
        val_02.val.field_2._8_8_ = in_stack_fffffffffffffb18;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb20._M_p;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb28;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb30;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffb38;
        UniValue::pushKV(__return_storage_ptr__,key_03,val_02);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3f8.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3f8.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8.val._M_dataplus._M_p != &local_3f8.val.field_2) {
          operator_delete(local_3f8.val._M_dataplus._M_p,
                          local_3f8.val.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_2e8._M_dataplus._M_p._1_7_,local_2e8._M_dataplus._M_p._0_1_) != paVar1
           ) {
          operator_delete((undefined1 *)
                          CONCAT71(local_2e8._M_dataplus._M_p._1_7_,local_2e8._M_dataplus._M_p._0_1_
                                  ),local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_3a0[0] != local_390) {
          operator_delete(local_3a0[0],local_390[0] + 1);
        }
        local_418[0] = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"txoutset_hash","");
        base_blob<256u>::ToString_abi_cxx11_(&local_2e8,&maybe_stats->hashSerialized);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_470,&local_2e8);
        key_04._M_string_length = (size_type)maybe_stats;
        key_04._M_dataplus._M_p = (pointer)tip;
        key_04.field_2._M_allocated_capacity = (size_type)pUVar14;
        key_04.field_2._8_8_ = val_05;
        val_03.val._M_dataplus._M_p = (pointer)ppVar17;
        val_03._0_8_ = ppVar15;
        val_03.val._M_string_length = (size_type)ppVar18;
        val_03.val.field_2._M_allocated_capacity = uVar19;
        val_03.val.field_2._8_8_ = in_stack_fffffffffffffb18;
        val_03.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb20._M_p;
        val_03.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb28;
        val_03.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb30;
        val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffb38;
        UniValue::pushKV(__return_storage_ptr__,key_04,val_03);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_470.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_470.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470.val._M_dataplus._M_p != &local_470.val.field_2) {
          operator_delete(local_470.val._M_dataplus._M_p,
                          local_470.val.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_2e8._M_dataplus._M_p._1_7_,local_2e8._M_dataplus._M_p._0_1_) != paVar1
           ) {
          operator_delete((undefined1 *)
                          CONCAT71(local_2e8._M_dataplus._M_p._1_7_,local_2e8._M_dataplus._M_p._0_1_
                                  ),local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_418[0] != local_408) {
          operator_delete(local_418[0],local_408[0] + 1);
        }
        local_490[0] = local_480;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"nchaintx","");
        UniValue::UniValue<const_unsigned_long_&,_unsigned_long,_true>
                  ((UniValue *)&stack0xfffffffffffffb18,&tip->m_chain_tx_count);
        key_05._M_string_length = (size_type)maybe_stats;
        key_05._M_dataplus._M_p = (pointer)tip;
        key_05.field_2._M_allocated_capacity = (size_type)pUVar14;
        key_05.field_2._8_8_ = val_05;
        val_04.val._M_dataplus._M_p = (pointer)ppVar17;
        val_04._0_8_ = ppVar15;
        val_04.val._M_string_length = (size_type)ppVar18;
        val_04.val.field_2._M_allocated_capacity = uVar19;
        val_04.val.field_2._8_8_ = in_stack_fffffffffffffb18;
        val_04.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb20._M_p;
        val_04.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb28;
        val_04.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb30;
        val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffb38;
        UniValue::pushKV(__return_storage_ptr__,key_05,val_04);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xfffffffffffffb40);
        if (in_stack_fffffffffffffb20._M_p != &stack0xfffffffffffffb30) {
          operator_delete(in_stack_fffffffffffffb20._M_p,in_stack_fffffffffffffb30 + 1);
        }
        if (local_490[0] != local_480) {
          operator_delete(local_490[0],local_480[0] + 1);
        }
        std::vector<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
        ::~vector((vector<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
                   *)&stack0xfffffffffffffaf8);
        if (0x1c < local_1b8.out.scriptPubKey.super_CScriptBase._size) {
          free(local_1b8.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
        }
        std::
        _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
        ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)local_158);
        BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~Timer(&local_98);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
LAB_0029f1bd:
        __stack_chk_fail();
      }
    }
  }
LAB_0029ee33:
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

UniValue WriteUTXOSnapshot(
    Chainstate& chainstate,
    CCoinsViewCursor* pcursor,
    CCoinsStats* maybe_stats,
    const CBlockIndex* tip,
    AutoFile& afile,
    const fs::path& path,
    const fs::path& temppath,
    const std::function<void()>& interruption_point)
{
    LOG_TIME_SECONDS(strprintf("writing UTXO snapshot at height %s (%s) to file %s (via %s)",
        tip->nHeight, tip->GetBlockHash().ToString(),
        fs::PathToString(path), fs::PathToString(temppath)));

    SnapshotMetadata metadata{chainstate.m_chainman.GetParams().MessageStart(), tip->GetBlockHash(), maybe_stats->coins_count};

    afile << metadata;

    COutPoint key;
    Txid last_hash;
    Coin coin;
    unsigned int iter{0};
    size_t written_coins_count{0};
    std::vector<std::pair<uint32_t, Coin>> coins;

    // To reduce space the serialization format of the snapshot avoids
    // duplication of tx hashes. The code takes advantage of the guarantee by
    // leveldb that keys are lexicographically sorted.
    // In the coins vector we collect all coins that belong to a certain tx hash
    // (key.hash) and when we have them all (key.hash != last_hash) we write
    // them to file using the below lambda function.
    // See also https://github.com/bitcoin/bitcoin/issues/25675
    auto write_coins_to_file = [&](AutoFile& afile, const Txid& last_hash, const std::vector<std::pair<uint32_t, Coin>>& coins, size_t& written_coins_count) {
        afile << last_hash;
        WriteCompactSize(afile, coins.size());
        for (const auto& [n, coin] : coins) {
            WriteCompactSize(afile, n);
            afile << coin;
            ++written_coins_count;
        }
    };

    pcursor->GetKey(key);
    last_hash = key.hash;
    while (pcursor->Valid()) {
        if (iter % 5000 == 0) interruption_point();
        ++iter;
        if (pcursor->GetKey(key) && pcursor->GetValue(coin)) {
            if (key.hash != last_hash) {
                write_coins_to_file(afile, last_hash, coins, written_coins_count);
                last_hash = key.hash;
                coins.clear();
            }
            coins.emplace_back(key.n, coin);
        }
        pcursor->Next();
    }

    if (!coins.empty()) {
        write_coins_to_file(afile, last_hash, coins, written_coins_count);
    }

    CHECK_NONFATAL(written_coins_count == maybe_stats->coins_count);

    afile.fclose();

    UniValue result(UniValue::VOBJ);
    result.pushKV("coins_written", written_coins_count);
    result.pushKV("base_hash", tip->GetBlockHash().ToString());
    result.pushKV("base_height", tip->nHeight);
    result.pushKV("path", path.utf8string());
    result.pushKV("txoutset_hash", maybe_stats->hashSerialized.ToString());
    result.pushKV("nchaintx", tip->m_chain_tx_count);
    return result;
}